

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTime.c
# Opt level: O3

float If_CutDelay(If_Man_t *p,If_Obj_t *pObj,If_Cut_t *pCut)

{
  char cVar1;
  If_Par_t *pIVar2;
  If_LibLut_t *pIVar3;
  void *pvVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  float *pfVar8;
  float fVar9;
  float fVar10;
  
  uVar7 = *(uint *)&pCut->field_0x1c;
  uVar5 = (ulong)(uVar7 >> 0x18);
  if ((short)uVar7 < 0) {
    if (0xffffff < uVar7) {
      fVar9 = -1e+20;
      uVar6 = 0;
      while( true ) {
        fVar10 = (&pCut[1].Area)[uVar6];
        if (((long)(int)fVar10 < 0) || (p->vObjs->nSize <= (int)fVar10)) break;
        pvVar4 = p->vObjs->pArray[(int)fVar10];
        if (pvVar4 == (void *)0x0) {
          return fVar9;
        }
        fVar10 = (float)p->pPars->nAndDelay + *(float *)((long)pvVar4 + 0x5c);
        if (fVar9 <= fVar10) {
          fVar9 = fVar10;
        }
        uVar6 = uVar6 + 1;
        if (uVar5 == uVar6) {
          return fVar9;
        }
      }
      goto LAB_0040d398;
    }
  }
  else {
    pIVar2 = p->pPars;
    pIVar3 = pIVar2->pLutLib;
    if (pIVar3 == (If_LibLut_t *)0x0) {
      if ((uVar7 >> 0xd & 1) == 0) {
        if (pIVar2->fLiftLeaves == 0) {
          if (0xffffff < uVar7) {
            fVar9 = -1e+20;
            uVar6 = 0;
            while( true ) {
              fVar10 = (&pCut[1].Area)[uVar6];
              if (((long)(int)fVar10 < 0) || (p->vObjs->nSize <= (int)fVar10)) break;
              pvVar4 = p->vObjs->pArray[(int)fVar10];
              if (pvVar4 == (void *)0x0) {
                return fVar9;
              }
              fVar10 = *(float *)((long)pvVar4 + 0x5c) + 1.0;
              if (fVar9 <= fVar10) {
                fVar9 = fVar10;
              }
              uVar6 = uVar6 + 1;
              if (uVar5 == uVar6) {
                return fVar9;
              }
            }
            goto LAB_0040d398;
          }
        }
        else if (0xffffff < uVar7) {
          fVar9 = -1e+20;
          uVar6 = 0;
          while( true ) {
            uVar7 = (int)(&pCut[1].Area)[uVar6] >> 8;
            if (((int)uVar7 < 0) || (p->vObjs->nSize <= (int)uVar7)) break;
            pvVar4 = p->vObjs->pArray[uVar7];
            if (pvVar4 == (void *)0x0) {
              return fVar9;
            }
            fVar10 = (*(float *)((long)pvVar4 + 0x5c) -
                     (float)(int)(((uint)(&pCut[1].Area)[uVar6] & 0xff) * p->Period)) + 1.0;
            if (fVar9 <= fVar10) {
              fVar9 = fVar10;
            }
            uVar6 = uVar6 + 1;
            if (uVar5 == uVar6) {
              return fVar9;
            }
          }
LAB_0040d398:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
      }
      else {
        if (pIVar2->fLiftLeaves != 0) {
          __assert_fail("!p->pPars->fLiftLeaves",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifTime.c"
                        ,0x88,"float If_CutDelay(If_Man_t *, If_Obj_t *, If_Cut_t *)");
        }
        if (0xffffff < uVar7) {
          fVar9 = -1e+20;
          uVar6 = 0;
          while( true ) {
            fVar10 = (&pCut[1].Area)[uVar6];
            if (((long)(int)fVar10 < 0) || (p->vObjs->nSize <= (int)fVar10)) break;
            pvVar4 = p->vObjs->pArray[(int)fVar10];
            if (pvVar4 == (void *)0x0) {
              return fVar9;
            }
            cVar1 = *(char *)((long)&pCut[1].Area + uVar6 + uVar5 * 4);
            fVar10 = -120.0;
            if (cVar1 != 'x') {
              fVar10 = (float)(int)cVar1;
            }
            fVar10 = fVar10 + *(float *)((long)pvVar4 + 0x5c);
            if (fVar9 <= fVar10) {
              fVar9 = fVar10;
            }
            uVar6 = uVar6 + 1;
            if (uVar5 == uVar6) {
              return fVar9;
            }
          }
          goto LAB_0040d398;
        }
      }
    }
    else {
      if (pIVar2->fLiftLeaves != 0) {
        __assert_fail("!p->pPars->fLiftLeaves",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifTime.c"
                      ,0x6f,"float If_CutDelay(If_Man_t *, If_Obj_t *, If_Cut_t *)");
      }
      pfVar8 = (float *)((long)pIVar3->pLutDelays[0] + (ulong)((uVar7 >> 0x18) << 7) + uVar5 * 4);
      if (pIVar3->fVarPinDelays == 0) {
        if (0xffffff < uVar7) {
          fVar9 = -1e+20;
          uVar6 = 0;
          while( true ) {
            fVar10 = (&pCut[1].Area)[uVar6];
            if (((long)(int)fVar10 < 0) || (p->vObjs->nSize <= (int)fVar10)) break;
            pvVar4 = p->vObjs->pArray[(int)fVar10];
            if (pvVar4 == (void *)0x0) {
              return fVar9;
            }
            fVar10 = *(float *)((long)pvVar4 + 0x5c) + *pfVar8;
            if (fVar9 <= fVar10) {
              fVar9 = fVar10;
            }
            uVar6 = uVar6 + 1;
            if (uVar5 == uVar6) {
              return fVar9;
            }
          }
          goto LAB_0040d398;
        }
      }
      else {
        If_CutSortInputPins(p,pCut,If_CutDelay::pPinPerm,If_CutDelay::pPinDelays);
        if (0xffffff < *(uint *)&pCut->field_0x1c) {
          fVar9 = -1e+20;
          uVar5 = 0;
          do {
            fVar10 = If_CutDelay::pPinDelays[*(int *)((long)If_CutDelay::pPinPerm + uVar5)] +
                     *(float *)((long)pfVar8 + uVar5);
            if (fVar9 <= fVar10) {
              fVar9 = fVar10;
            }
            uVar5 = uVar5 + 4;
          } while ((*(uint *)&pCut->field_0x1c >> 0x16 & 0xfffffffc) != uVar5);
          return fVar9;
        }
      }
    }
  }
  return -1e+20;
}

Assistant:

float If_CutDelay( If_Man_t * p, If_Obj_t * pObj, If_Cut_t * pCut )
{
    static int pPinPerm[IF_MAX_LUTSIZE];
    static float pPinDelays[IF_MAX_LUTSIZE];
    char * pPerm = If_CutPerm( pCut );
    If_Obj_t * pLeaf;
    float Delay, DelayCur;
    float * pLutDelays;
    int i, Shift, Pin2PinDelay;//, iLeaf;
    Delay = -IF_FLOAT_LARGE;
    if ( pCut->fAndCut )
    {
        If_CutForEachLeaf( p, pCut, pLeaf, i )
        {
            DelayCur = If_ObjCutBest(pLeaf)->Delay + p->pPars->nAndDelay;
            Delay = IF_MAX( Delay, DelayCur );
        }
    }
    else if ( p->pPars->pLutLib )
    {
        assert( !p->pPars->fLiftLeaves );
        pLutDelays = p->pPars->pLutLib->pLutDelays[pCut->nLeaves];
        if ( p->pPars->pLutLib->fVarPinDelays )
        {
            // compute the delay using sorted pins
            If_CutSortInputPins( p, pCut, pPinPerm, pPinDelays );
            for ( i = 0; i < (int)pCut->nLeaves; i++ )
            {
                DelayCur = pPinDelays[pPinPerm[i]] + pLutDelays[i];
                Delay = IF_MAX( Delay, DelayCur );
            }
        }
        else
        {
            If_CutForEachLeaf( p, pCut, pLeaf, i )
            {
                DelayCur = If_ObjCutBest(pLeaf)->Delay + pLutDelays[0];
                Delay = IF_MAX( Delay, DelayCur );
            }
        }
    }
    else
    {
        if ( pCut->fUser )
        {
            assert( !p->pPars->fLiftLeaves );
            If_CutForEachLeaf( p, pCut, pLeaf, i )
            {
                Pin2PinDelay = pPerm ? (pPerm[i] == IF_BIG_CHAR ? -IF_BIG_CHAR : pPerm[i]) : 1;
                DelayCur = If_ObjCutBest(pLeaf)->Delay + (float)Pin2PinDelay;
                Delay = IF_MAX( Delay, DelayCur );
            }
        }
        else
        {
            if ( p->pPars->fLiftLeaves )
            {
                If_CutForEachLeafSeq( p, pCut, pLeaf, Shift, i )
                {
                    DelayCur = If_ObjCutBest(pLeaf)->Delay - Shift * p->Period;
                    Delay = IF_MAX( Delay, DelayCur + 1.0 );
                }
            }
            else
            {
                If_CutForEachLeaf( p, pCut, pLeaf, i )
                {
                    DelayCur = If_ObjCutBest(pLeaf)->Delay + 1.0;
                    Delay = IF_MAX( Delay, DelayCur );
                }
            }
        }
    }
    return Delay;
}